

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall bssl::anon_unknown_0::QUICMethodTest::~QUICMethodTest(QUICMethodTest *this)

{
  pointer puVar1;
  MockQUICTransportPair *this_00;
  MockQUICTransportPair *in_RSI;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__QUICMethodTest_0043c988;
  puVar1 = (this->server_quic_early_data_context_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    in_RSI = (MockQUICTransportPair *)
             ((this->server_quic_early_data_context_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + -(long)puVar1);
    operator_delete(puVar1,(ulong)in_RSI);
  }
  puVar1 = (this->server_transport_params_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    in_RSI = (MockQUICTransportPair *)
             ((this->server_transport_params_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + -(long)puVar1);
    operator_delete(puVar1,(ulong)in_RSI);
  }
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&this->server_);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&this->client_);
  this_00 = (this->transport_)._M_t.
            super___uniq_ptr_impl<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
            ._M_t.
            super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
            .super__Head_base<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_false>.
            _M_head_impl;
  if (this_00 != (MockQUICTransportPair *)0x0) {
    std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>::operator()
              ((default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair> *)this_00,in_RSI)
    ;
  }
  (this->transport_)._M_t.
  super___uniq_ptr_impl<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
  ._M_t.
  super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
  .super__Head_base<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_false>._M_head_impl =
       (MockQUICTransportPair *)0x0;
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&this->server_ctx_);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&this->client_ctx_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void SetUp() override {
    client_ctx_.reset(SSL_CTX_new(TLS_method()));
    server_ctx_ = CreateContextWithTestCertificate(TLS_method());
    ASSERT_TRUE(client_ctx_);
    ASSERT_TRUE(server_ctx_);

    SSL_CTX_set_min_proto_version(server_ctx_.get(), TLS1_3_VERSION);
    SSL_CTX_set_max_proto_version(server_ctx_.get(), TLS1_3_VERSION);
    SSL_CTX_set_min_proto_version(client_ctx_.get(), TLS1_3_VERSION);
    SSL_CTX_set_max_proto_version(client_ctx_.get(), TLS1_3_VERSION);

    static const uint8_t kALPNProtos[] = {0x03, 'f', 'o', 'o'};
    ASSERT_EQ(SSL_CTX_set_alpn_protos(client_ctx_.get(), kALPNProtos,
                                      sizeof(kALPNProtos)),
              0);
    SSL_CTX_set_alpn_select_cb(
        server_ctx_.get(),
        [](SSL *ssl, const uint8_t **out, uint8_t *out_len, const uint8_t *in,
           unsigned in_len, void *arg) -> int {
          return SSL_select_next_proto(
                     const_cast<uint8_t **>(out), out_len, in, in_len,
                     kALPNProtos, sizeof(kALPNProtos)) == OPENSSL_NPN_NEGOTIATED
                     ? SSL_TLSEXT_ERR_OK
                     : SSL_TLSEXT_ERR_NOACK;
        },
        nullptr);
  }